

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::ElabSystemTaskSymbol::issueDiagnostic(ElabSystemTaskSymbol *this)

{
  string_view message;
  bool bVar1;
  Scope *pSVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  Diagnostic *this_00;
  Symbol *in_RDI;
  DiagCode code;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> msg;
  Scope *scope;
  ElabSystemTaskSymbol *in_stack_000001f0;
  string *in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  Expression *in_stack_ffffffffffffffa0;
  Scope *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  DiagCode local_2c [3];
  Scope *in_stack_ffffffffffffffe0;
  SourceLocation in_stack_ffffffffffffffe8;
  DiagCode code_00;
  
  pSVar2 = Symbol::getParentScope(in_RDI);
  code_00 = SUB84((ulong)pSVar2 >> 0x20,0);
  getMessage(in_stack_000001f0);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x48abfa);
  if (bVar1) {
    DiagCode::DiagCode(local_2c);
    switch(in_RDI[1].kind) {
    case Unknown:
      local_2c[0].subsystem = Declarations;
      local_2c[0].code = 0x3c;
      break;
    case Root:
      local_2c[0].subsystem = Declarations;
      local_2c[0].code = 0x35;
      break;
    case Definition:
      local_2c[0].subsystem = Declarations;
      local_2c[0].code = 0x100;
      break;
    case CompilationUnit:
      local_2c[0].subsystem = Declarations;
      local_2c[0].code = 0xe4;
      break;
    case DeferredMember:
      pbVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                         ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          0x48acac);
      message._M_len._4_4_ = in_stack_ffffffffffffffb4;
      message._M_len._0_4_ = in_stack_ffffffffffffffb0;
      message._M_str = (char *)pbVar3->_M_len;
      reportStaticAssert(in_stack_ffffffffffffffa8,(SourceLocation)pbVar3->_M_str,message,
                         in_stack_ffffffffffffffa0);
      return;
    }
    this_00 = Scope::addDiag(in_stack_ffffffffffffffe0,code_00,in_stack_ffffffffffffffe8);
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x48ad37);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    Diagnostic::addStringAllowEmpty(this_00,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::issueDiagnostic() const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto msg = getMessage();
    if (!msg)
        return;

    DiagCode code;
    switch (taskKind) {
        case ElabSystemTaskKind::Fatal:
            code = diag::FatalTask;
            break;
        case ElabSystemTaskKind::Error:
            code = diag::ErrorTask;
            break;
        case ElabSystemTaskKind::Warning:
            code = diag::WarningTask;
            break;
        case ElabSystemTaskKind::Info:
            code = diag::InfoTask;
            break;
        case ElabSystemTaskKind::StaticAssert:
            reportStaticAssert(*scope, location, *msg, assertCondition);
            return;
    }

    scope->addDiag(code, location).addStringAllowEmpty(std::string(*msg));
}